

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O0

void * override_GL_glXGetProcAddress(char *name)

{
  void *handle;
  code *pcVar1;
  _func_void_ptr_char_ptr *real_func;
  void *lib;
  void *symbol;
  char *name_local;
  
  name_local = (char *)wrapped_dlsym("GL",name);
  if (name_local == (char *)0x0) {
    handle = dlwrap_real_dlopen("libGL.so.1",1);
    pcVar1 = (code *)dlwrap_real_dlsym(handle,"glXGetProcAddress");
    name_local = (char *)(*pcVar1)(name);
  }
  return name_local;
}

Assistant:

void *
override_GL_glXGetProcAddress(const char *name)
{
    void *symbol;

    symbol = wrapped_dlsym("GL", name);
    if (symbol)
        return symbol;

    return DEFER_TO_GL("libGL.so.1", override_GL_glXGetProcAddress,
                       "glXGetProcAddress", (name));
}